

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeCommandListGetNextCommandIdWithKernelsExp
          (ze_command_list_handle_t hCommandList,ze_mutable_command_id_exp_desc_t *desc,
          uint32_t numKernels,ze_kernel_handle_t *phKernels,uint64_t *pCommandId)

{
  code *pcVar1;
  undefined8 uVar2;
  ulong uVar3;
  void *pvVar4;
  ulong local_60;
  size_t i;
  ze_kernel_handle_t *phKernelsLocal;
  ze_pfnCommandListGetNextCommandIdWithKernelsExp_t pfnGetNextCommandIdWithKernelsExp;
  dditable_t *dditable;
  ze_result_t result;
  uint64_t *pCommandId_local;
  ze_kernel_handle_t *phKernels_local;
  uint32_t numKernels_local;
  ze_mutable_command_id_exp_desc_t *desc_local;
  ze_command_list_handle_t hCommandList_local;
  
  pcVar1 = *(code **)(*(long *)(hCommandList + 8) + 0x360);
  if (pcVar1 == (code *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = *(undefined8 *)hCommandList;
    uVar3 = SUB168(ZEXT416(numKernels) * ZEXT816(8),0);
    if (SUB168(ZEXT416(numKernels) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    for (local_60 = 0; phKernels != (ze_kernel_handle_t *)0x0 && local_60 < numKernels;
        local_60 = local_60 + 1) {
      *(undefined8 *)((long)pvVar4 + local_60 * 8) = *(undefined8 *)phKernels[local_60];
    }
    hCommandList_local._4_4_ = (*pcVar1)(uVar2,desc,numKernels,pvVar4,pCommandId);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListGetNextCommandIdWithKernelsExp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        const ze_mutable_command_id_exp_desc_t* desc,   ///< [in][out] pointer to mutable command identifier descriptor
        uint32_t numKernels,                            ///< [in][optional] number of entries on phKernels list
        ze_kernel_handle_t* phKernels,                  ///< [in][optional][range(0, numKernels)] list of kernels that user can
                                                        ///< switch between using ::zeCommandListUpdateMutableCommandKernelsExp
                                                        ///< call
        uint64_t* pCommandId                            ///< [out] pointer to mutable command identifier to be written
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnGetNextCommandIdWithKernelsExp = dditable->ze.CommandListExp.pfnGetNextCommandIdWithKernelsExp;
        if( nullptr == pfnGetNextCommandIdWithKernelsExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handles to driver handles
        auto phKernelsLocal = new ze_kernel_handle_t [numKernels];
        for( size_t i = 0; ( nullptr != phKernels ) && ( i < numKernels ); ++i )
            phKernelsLocal[ i ] = reinterpret_cast<ze_kernel_object_t*>( phKernels[ i ] )->handle;

        // forward to device-driver
        result = pfnGetNextCommandIdWithKernelsExp( hCommandList, desc, numKernels, phKernelsLocal, pCommandId );
        delete []phKernelsLocal;

        return result;
    }